

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unordered_map.cpp
# Opt level: O2

bool operator==(string self,case_insensitive other)

{
  bool bVar1;
  undefined1 local_4 [4];
  
  bVar1 = std::operator==(self.data_,self.data_ + self.size_,local_4);
  return bVar1;
}

Assistant:

bool operator==(frozen::string self, case_insensitive other) {
    return std::equal(self.begin(), self.end(), other.data, other.data + 3,
        [](char s, char o) { return std::tolower(s) == std::tolower(o);});
  }